

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-value.c
# Opt level: O0

void test_double(void)

{
  int iVar1;
  VALUE_TYPE VVar2;
  int32_t iVar3;
  uint32_t uVar4;
  int64_t iVar5;
  uint64_t uVar6;
  float fVar7;
  double dVar8;
  VALUE v;
  VALUE_TYPE in_stack_00000044;
  VALUE *in_stack_00000048;
  VALUE *in_stack_ffffffffffffffe8;
  VALUE *in_stack_fffffffffffffff8;
  
  iVar1 = value_init_double(in_stack_ffffffffffffffe8,5.37084929755936e-318);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x1dd,"%s","value_init_double(NULL, 0.0) != 0");
  value_init_double(in_stack_ffffffffffffffe8,5.37115067760332e-318);
  VVar2 = value_type((VALUE *)&stack0xfffffffffffffff0);
  acutest_check_((int)(ulong)(VVar2 == VALUE_DOUBLE),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x1e0,"%s","value_type(&v) == VALUE_DOUBLE");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x1e1,"%s","!value_is_compatible(&v, VALUE_NULL)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x1e2,"%s","!value_is_compatible(&v, VALUE_BOOL)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x1e3,"%s","value_is_compatible(&v, VALUE_INT32)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x1e4,"%s","value_is_compatible(&v, VALUE_UINT32)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x1e5,"%s","value_is_compatible(&v, VALUE_INT64)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x1e6,"%s","value_is_compatible(&v, VALUE_UINT64)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x1e7,"%s","value_is_compatible(&v, VALUE_FLOAT)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x1e8,"%s","value_is_compatible(&v, VALUE_DOUBLE)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x1e9,"%s","!value_is_compatible(&v, VALUE_ARRAY)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x1ea,"%s","!value_is_compatible(&v, VALUE_DICT)");
  iVar3 = value_int32((VALUE *)v.data._0_8_);
  acutest_check_((int)(ulong)(iVar3 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x1eb,"%s","value_int32(&v) == 0");
  uVar4 = value_uint32((VALUE *)v.data._0_8_);
  acutest_check_((int)(ulong)(uVar4 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x1ec,"%s","value_uint32(&v) == 0");
  iVar5 = value_int64((VALUE *)v.data._0_8_);
  acutest_check_((int)(ulong)(iVar5 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x1ed,"%s","value_int64(&v) == 0");
  uVar6 = value_uint64((VALUE *)v.data._0_8_);
  acutest_check_((int)(ulong)(uVar6 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x1ee,"%s","value_uint64(&v) == 0");
  fVar7 = value_float((VALUE *)v.data._0_8_);
  iVar1 = FLOAT_EQ(fVar7,0.0);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x1ef,"%s","FLOAT_EQ(value_float(&v), 0.0f)");
  dVar8 = value_double(in_stack_fffffffffffffff8);
  iVar1 = DOUBLE_EQ(dVar8,0.0);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x1f0,"%s","DOUBLE_EQ(value_double(&v), 0.0)");
  value_fini((VALUE *)0x109aca);
  value_init_double(in_stack_ffffffffffffffe8,5.37652117117361e-318);
  VVar2 = value_type((VALUE *)&stack0xfffffffffffffff0);
  acutest_check_((int)(ulong)(VVar2 == VALUE_DOUBLE),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,500,"%s","value_type(&v) == VALUE_DOUBLE");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x1f5,"%s","!value_is_compatible(&v, VALUE_NULL)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x1f6,"%s","!value_is_compatible(&v, VALUE_BOOL)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x1f7,"%s","value_is_compatible(&v, VALUE_INT32)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x1f8,"%s","!value_is_compatible(&v, VALUE_UINT32)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x1f9,"%s","value_is_compatible(&v, VALUE_INT64)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x1fa,"%s","!value_is_compatible(&v, VALUE_UINT64)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x1fb,"%s","value_is_compatible(&v, VALUE_FLOAT)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x1fc,"%s","value_is_compatible(&v, VALUE_DOUBLE)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x1fd,"%s","!value_is_compatible(&v, VALUE_ARRAY)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x1fe,"%s","!value_is_compatible(&v, VALUE_DICT)");
  iVar3 = value_int32((VALUE *)v.data._0_8_);
  acutest_check_((int)(ulong)(iVar3 == -1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x1ff,"%s","value_int32(&v) == -1");
  iVar5 = value_int64((VALUE *)v.data._0_8_);
  acutest_check_((int)(ulong)(iVar5 == -1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x200,"%s","value_int64(&v) == -1");
  fVar7 = value_float((VALUE *)v.data._0_8_);
  iVar1 = FLOAT_EQ(fVar7,-1.0);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x201,"%s","FLOAT_EQ(value_float(&v), -1.0f)");
  dVar8 = value_double(in_stack_fffffffffffffff8);
  iVar1 = DOUBLE_EQ(dVar8,-1.0);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x202,"%s","DOUBLE_EQ(value_double(&v), -1.0)");
  value_fini((VALUE *)0x109ea2);
  value_init_double(in_stack_ffffffffffffffe8,5.38138277712869e-318);
  VVar2 = value_type((VALUE *)&stack0xfffffffffffffff0);
  acutest_check_((int)(ulong)(VVar2 == VALUE_DOUBLE),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x206,"%s","value_type(&v) == VALUE_DOUBLE");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x207,"%s","!value_is_compatible(&v, VALUE_NULL)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x208,"%s","!value_is_compatible(&v, VALUE_BOOL)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x209,"%s","!value_is_compatible(&v, VALUE_INT32)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x20a,"%s","!value_is_compatible(&v, VALUE_UINT32)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x20b,"%s","!value_is_compatible(&v, VALUE_INT64)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x20c,"%s","!value_is_compatible(&v, VALUE_UINT64)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x20d,"%s","value_is_compatible(&v, VALUE_FLOAT)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x20e,"%s","value_is_compatible(&v, VALUE_DOUBLE)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x20f,"%s","!value_is_compatible(&v, VALUE_ARRAY)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x210,"%s","!value_is_compatible(&v, VALUE_DICT)");
  iVar3 = value_int32((VALUE *)v.data._0_8_);
  acutest_check_((int)(ulong)(iVar3 == 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x211,"%s","value_int32(&v) == 1");
  iVar5 = value_int64((VALUE *)v.data._0_8_);
  acutest_check_((int)(ulong)(iVar5 == 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x212,"%s","value_int64(&v) == 1");
  fVar7 = value_float((VALUE *)v.data._0_8_);
  iVar1 = FLOAT_EQ(fVar7,0.5);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x213,"%s","FLOAT_EQ(value_float(&v), 0.5f)");
  dVar8 = value_double(in_stack_fffffffffffffff8);
  iVar1 = DOUBLE_EQ(dVar8,0.5);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x214,"%s","DOUBLE_EQ(value_double(&v), 0.5)");
  value_fini((VALUE *)0x10a27e);
  value_init_double(in_stack_ffffffffffffffe8,5.3862641457096e-318);
  iVar3 = value_int32((VALUE *)v.data._0_8_);
  acutest_check_((int)(ulong)(iVar3 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x218,"%s","value_int32(&v) == 0");
  iVar5 = value_int64((VALUE *)v.data._0_8_);
  acutest_check_((int)(ulong)(iVar5 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x219,"%s","value_int64(&v) == 0");
  fVar7 = value_float((VALUE *)v.data._0_8_);
  iVar1 = FLOAT_EQ(fVar7,0.4);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x21a,"%s","FLOAT_EQ(value_float(&v), 0.4f)");
  dVar8 = value_double(in_stack_fffffffffffffff8);
  iVar1 = DOUBLE_EQ(dVar8,0.4);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x21b,"%s","DOUBLE_EQ(value_double(&v), 0.4)");
  value_fini((VALUE *)0x10a39d);
  value_init_double(in_stack_ffffffffffffffe8,5.38768211411317e-318);
  iVar3 = value_int32((VALUE *)v.data._0_8_);
  acutest_check_((int)(ulong)(iVar3 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x21f,"%s","value_int32(&v) == 0");
  iVar5 = value_int64((VALUE *)v.data._0_8_);
  acutest_check_((int)(ulong)(iVar5 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x220,"%s","value_int64(&v) == 0");
  fVar7 = value_float((VALUE *)v.data._0_8_);
  iVar1 = FLOAT_EQ(fVar7,-0.4);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x221,"%s","FLOAT_EQ(value_float(&v), -0.4f)");
  dVar8 = value_double(in_stack_fffffffffffffff8);
  iVar1 = DOUBLE_EQ(dVar8,-0.4);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x222,"%s","DOUBLE_EQ(value_double(&v), -0.4)");
  value_fini((VALUE *)0x10a4bc);
  value_init_double(in_stack_ffffffffffffffe8,5.38910008251673e-318);
  iVar3 = value_int32((VALUE *)v.data._0_8_);
  acutest_check_((int)(ulong)(iVar3 == -1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x226,"%s","value_int32(&v) == -1");
  iVar5 = value_int64((VALUE *)v.data._0_8_);
  acutest_check_((int)(ulong)(iVar5 == -1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x227,"%s","value_int64(&v) == -1");
  fVar7 = value_float((VALUE *)v.data._0_8_);
  iVar1 = FLOAT_EQ(fVar7,-0.5);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x228,"%s","FLOAT_EQ(value_float(&v), -0.5f)");
  dVar8 = value_double(in_stack_fffffffffffffff8);
  iVar1 = DOUBLE_EQ(dVar8,-0.5);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x229,"%s","DOUBLE_EQ(value_double(&v), -0.5)");
  value_fini((VALUE *)0x10a5db);
  return;
}

Assistant:

static void
test_double(void)
{
    VALUE v;

    TEST_CHECK(value_init_double(NULL, 0.0) != 0);

    value_init_double(&v, 0.0);
    TEST_CHECK(value_type(&v) == VALUE_DOUBLE);
    TEST_CHECK(!value_is_compatible(&v, VALUE_NULL));
    TEST_CHECK(!value_is_compatible(&v, VALUE_BOOL));
    TEST_CHECK(value_is_compatible(&v, VALUE_INT32));
    TEST_CHECK(value_is_compatible(&v, VALUE_UINT32));
    TEST_CHECK(value_is_compatible(&v, VALUE_INT64));
    TEST_CHECK(value_is_compatible(&v, VALUE_UINT64));
    TEST_CHECK(value_is_compatible(&v, VALUE_FLOAT));
    TEST_CHECK(value_is_compatible(&v, VALUE_DOUBLE));
    TEST_CHECK(!value_is_compatible(&v, VALUE_ARRAY));
    TEST_CHECK(!value_is_compatible(&v, VALUE_DICT));
    TEST_CHECK(value_int32(&v) == 0);
    TEST_CHECK(value_uint32(&v) == 0);
    TEST_CHECK(value_int64(&v) == 0);
    TEST_CHECK(value_uint64(&v) == 0);
    TEST_CHECK(FLOAT_EQ(value_float(&v), 0.0f));
    TEST_CHECK(DOUBLE_EQ(value_double(&v), 0.0));
    value_fini(&v);

    value_init_double(&v, -1.0);
    TEST_CHECK(value_type(&v) == VALUE_DOUBLE);
    TEST_CHECK(!value_is_compatible(&v, VALUE_NULL));
    TEST_CHECK(!value_is_compatible(&v, VALUE_BOOL));
    TEST_CHECK(value_is_compatible(&v, VALUE_INT32));
    TEST_CHECK(!value_is_compatible(&v, VALUE_UINT32));
    TEST_CHECK(value_is_compatible(&v, VALUE_INT64));
    TEST_CHECK(!value_is_compatible(&v, VALUE_UINT64));
    TEST_CHECK(value_is_compatible(&v, VALUE_FLOAT));
    TEST_CHECK(value_is_compatible(&v, VALUE_DOUBLE));
    TEST_CHECK(!value_is_compatible(&v, VALUE_ARRAY));
    TEST_CHECK(!value_is_compatible(&v, VALUE_DICT));
    TEST_CHECK(value_int32(&v) == -1);
    TEST_CHECK(value_int64(&v) == -1);
    TEST_CHECK(FLOAT_EQ(value_float(&v), -1.0f));
    TEST_CHECK(DOUBLE_EQ(value_double(&v), -1.0));
    value_fini(&v);

    value_init_double(&v, 0.5);
    TEST_CHECK(value_type(&v) == VALUE_DOUBLE);
    TEST_CHECK(!value_is_compatible(&v, VALUE_NULL));
    TEST_CHECK(!value_is_compatible(&v, VALUE_BOOL));
    TEST_CHECK(!value_is_compatible(&v, VALUE_INT32));
    TEST_CHECK(!value_is_compatible(&v, VALUE_UINT32));
    TEST_CHECK(!value_is_compatible(&v, VALUE_INT64));
    TEST_CHECK(!value_is_compatible(&v, VALUE_UINT64));
    TEST_CHECK(value_is_compatible(&v, VALUE_FLOAT));
    TEST_CHECK(value_is_compatible(&v, VALUE_DOUBLE));
    TEST_CHECK(!value_is_compatible(&v, VALUE_ARRAY));
    TEST_CHECK(!value_is_compatible(&v, VALUE_DICT));
    TEST_CHECK(value_int32(&v) == 1);
    TEST_CHECK(value_int64(&v) == 1);
    TEST_CHECK(FLOAT_EQ(value_float(&v), 0.5f));
    TEST_CHECK(DOUBLE_EQ(value_double(&v), 0.5));
    value_fini(&v);

    value_init_double(&v, 0.4);
    TEST_CHECK(value_int32(&v) == 0);
    TEST_CHECK(value_int64(&v) == 0);
    TEST_CHECK(FLOAT_EQ(value_float(&v), 0.4f));
    TEST_CHECK(DOUBLE_EQ(value_double(&v), 0.4));
    value_fini(&v);

    value_init_double(&v, -0.4);
    TEST_CHECK(value_int32(&v) == 0);
    TEST_CHECK(value_int64(&v) == 0);
    TEST_CHECK(FLOAT_EQ(value_float(&v), -0.4f));
    TEST_CHECK(DOUBLE_EQ(value_double(&v), -0.4));
    value_fini(&v);

    value_init_double(&v, -0.5);
    TEST_CHECK(value_int32(&v) == -1);
    TEST_CHECK(value_int64(&v) == -1);
    TEST_CHECK(FLOAT_EQ(value_float(&v), -0.5f));
    TEST_CHECK(DOUBLE_EQ(value_double(&v), -0.5));
    value_fini(&v);
}